

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M680XDisassembler.c
# Opt level: O3

void tfm_hdlr(MCInst *MI,m680x_info *info,uint16_t *address)

{
  long lVar1;
  byte bVar2;
  uint uVar3;
  
  lVar1 = (ulong)*address - (ulong)info->offset;
  if ((uint)lVar1 < info->size) {
    bVar2 = info->code[lVar1];
  }
  else {
    bVar2 = 0;
  }
  uVar3 = MI->Opcode + 200 & 0xff;
  add_indexed_operand(info,g_tfr_exg_reg_ids[bVar2 >> 4],true,tfm_hdlr::inc_dec_r0[uVar3],'\0',0,
                      true);
  add_indexed_operand(info,g_tfr_exg_reg_ids[bVar2 & 0xf],true,tfm_hdlr::inc_dec_r1[uVar3],'\0',0,
                      true);
  add_reg_to_rw_list((MCInst *)MI->flat_insn->detail,M680X_REG_W,MODIFY);
  return;
}

Assistant:

static void tfm_hdlr(MCInst *MI, m680x_info *info, uint16_t *address)
{
	static const uint8_t inc_dec_r0[] = {
		1, -1, 1, 0,
	};
	static const uint8_t inc_dec_r1[] = {
		1, -1, 0, 1,
	};
	uint8_t regs = 0;
	uint8_t index = (MI->Opcode & 0xff) - 0x38;

	read_byte(info, &regs, *address);

	add_indexed_operand(info, g_tfr_exg_reg_ids[regs >> 4], true,
		inc_dec_r0[index], M680X_OFFSET_NONE, 0, true);
	add_indexed_operand(info, g_tfr_exg_reg_ids[regs & 0x0f], true,
		inc_dec_r1[index], M680X_OFFSET_NONE, 0, true);

	add_reg_to_rw_list(MI, M680X_REG_W, READ | WRITE);
}